

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtPoolAllocator.h
# Opt level: O3

void __thiscall
cbtPoolAllocator::cbtPoolAllocator(cbtPoolAllocator *this,int elemSize,int maxElements)

{
  int iVar1;
  uchar *puVar2;
  uchar *puVar3;
  int iVar4;
  
  this->m_elemSize = elemSize;
  this->m_maxElements = maxElements;
  (this->m_mutex).mLock = 0;
  puVar2 = (uchar *)cbtAlignedAllocInternal((ulong)(uint)(maxElements * elemSize),0x10);
  this->m_pool = puVar2;
  this->m_firstFree = puVar2;
  this->m_freeCount = this->m_maxElements;
  iVar4 = this->m_maxElements + -1;
  if (iVar4 != 0) {
    iVar1 = this->m_elemSize;
    puVar3 = puVar2;
    do {
      puVar2 = puVar3 + iVar1;
      iVar4 = iVar4 + -1;
      *(uchar **)puVar3 = puVar2;
      puVar3 = puVar2;
    } while (iVar4 != 0);
  }
  puVar2[0] = '\0';
  puVar2[1] = '\0';
  puVar2[2] = '\0';
  puVar2[3] = '\0';
  puVar2[4] = '\0';
  puVar2[5] = '\0';
  puVar2[6] = '\0';
  puVar2[7] = '\0';
  return;
}

Assistant:

cbtPoolAllocator(int elemSize, int maxElements)
		: m_elemSize(elemSize),
		  m_maxElements(maxElements)
	{
		m_pool = (unsigned char*)cbtAlignedAlloc(static_cast<unsigned int>(m_elemSize * m_maxElements), 16);

		unsigned char* p = m_pool;
		m_firstFree = p;
		m_freeCount = m_maxElements;
		int count = m_maxElements;
		while (--count)
		{
			*(void**)p = (p + m_elemSize);
			p += m_elemSize;
		}
		*(void**)p = 0;
	}